

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5RowidCmp(Fts5Expr *pExpr,i64 iLhs,i64 iRhs)

{
  i64 iRhs_local;
  i64 iLhs_local;
  Fts5Expr *pExpr_local;
  
  if (pExpr->bDesc == 0) {
    if (iLhs < iRhs) {
      pExpr_local._4_4_ = 0xffffffff;
    }
    else {
      pExpr_local._4_4_ = (uint)(iRhs < iLhs);
    }
  }
  else if (iRhs < iLhs) {
    pExpr_local._4_4_ = 0xffffffff;
  }
  else {
    pExpr_local._4_4_ = (uint)(iLhs < iRhs);
  }
  return pExpr_local._4_4_;
}

Assistant:

static int fts5RowidCmp(
  Fts5Expr *pExpr,
  i64 iLhs,
  i64 iRhs
){
  assert( pExpr->bDesc==0 || pExpr->bDesc==1 );
  if( pExpr->bDesc==0 ){
    if( iLhs<iRhs ) return -1;
    return (iLhs > iRhs);
  }else{
    if( iLhs>iRhs ) return -1;
    return (iLhs < iRhs);
  }
}